

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O1

bool tinyusdz::hasTripleQuotes(string *str,bool is_double_quote)

{
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  uVar1 = str->_M_string_length;
  bVar4 = uVar1 != 0;
  if (bVar4) {
    pcVar2 = (str->_M_dataplus)._M_p;
    uVar3 = 1;
    do {
      if (uVar3 + 2 < uVar1) {
        if (is_double_quote) {
          if (((pcVar2[uVar3 - 1] == '\"') && (pcVar2[uVar3] == '\"')) &&
             (pcVar2[uVar3 + 1] == '\"')) {
            return bVar4;
          }
        }
        else if (((pcVar2[uVar3 - 1] == '\'') && (pcVar2[uVar3] == '\'')) &&
                (pcVar2[uVar3 + 1] == '\'')) {
          return bVar4;
        }
      }
      bVar4 = uVar3 < uVar1;
      bVar5 = uVar3 != uVar1;
      uVar3 = uVar3 + 1;
    } while (bVar5);
  }
  return bVar4;
}

Assistant:

bool hasTripleQuotes(const std::string &str, bool is_double_quote) {
  for (size_t i = 0; i < str.size(); i++) {
    if (i + 3 < str.size()) {
      if (is_double_quote) {
        if ((str[i + 0] == '"') && (str[i + 1] == '"') && (str[i + 2] == '"')) {
          return true;
        }
      } else {
        if ((str[i + 0] == '\'') && (str[i + 1] == '\'') &&
            (str[i + 2] == '\'')) {
          return true;
        }
      }
    }
  }

  return false;
}